

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O0

void mh_assoc_del_resize(mh_assoc_t *h,mh_int_t x,void *arg)

{
  mh_assoc_t *h_00;
  mh_int_t x_00;
  uint32_t y;
  mh_assoc_t *s;
  void *arg_local;
  mh_int_t x_local;
  mh_assoc_t *h_local;
  
  h_00 = h->shadow;
  x_00 = mh_assoc_get(h_00,h->p + x,arg);
  mh_assoc_del(h_00,x_00,arg);
  mh_assoc_resize(h,arg);
  return;
}

Assistant:

void __attribute__((noinline))
_mh(del_resize)(struct _mh(t) *h, mh_int_t x,
		mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
	uint32_t y = _mh(get)(s, (const mh_node_t *) &(h->p[x]),
			      arg);
	_mh(del)(s, y, arg);
	_mh(resize)(h, arg);
}